

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void __thiscall Image::fillSides(Image *this)

{
  long lVar1;
  int x_1;
  int x;
  uint8_t *data;
  int y;
  Image *this_local;
  
  for (y = 0; y < *(int *)&this->field_0x8; y = y + 1) {
    lVar1 = *(long *)&this->field_0x10 + (long)(y * *(int *)&this->field_0xc);
    for (x = 0; (x < *(int *)&this->field_0xc && (*(char *)(lVar1 + x) == -1)); x = x + 1) {
      *(undefined1 *)(lVar1 + x) = 0;
    }
    x_1 = *(int *)&this->field_0xc;
    while ((x_1 = x_1 + -1, -1 < x_1 && (*(char *)(lVar1 + x_1) == -1))) {
      *(undefined1 *)(lVar1 + x_1) = 0;
    }
  }
  return;
}

Assistant:

void Image::fillSides() {
  // Fill the contour with black pixels (left side)
  for (auto y = 0; y < m_.rows; y++) {
    uint8_t* data = (uint8_t*) m_.data + y * m_.cols;
    for (auto x = 0; x < m_.cols; x++) {
      if (data[x] == 0xff) {
        data[x] = 0x00;
      } else {
        break;
      }
    }
    for (auto x = m_.cols - 1; x >= 0; x--) {
      if (data[x] == 0xff) {
        data[x] = 0x00;
      } else {
        break;
      }
    }
  }
}